

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v6::internal::format_uint<4u,wchar_t,unsigned_long>
                    (wchar_t *buffer,unsigned_long value,int num_digits,bool upper)

{
  char *pcVar1;
  uint digit;
  char *digits;
  wchar_t *end;
  bool upper_local;
  int num_digits_local;
  unsigned_long value_local;
  wchar_t *buffer_local;
  
  value_local = value;
  buffer_local = buffer + num_digits;
  do {
    pcVar1 = "0123456789abcdef";
    if (upper) {
      pcVar1 = "0123456789ABCDEF";
    }
    buffer_local[-1] = (int)pcVar1[(uint)value_local & 0xf];
    value_local = value_local >> 4;
    buffer_local = buffer_local + -1;
  } while (value_local != 0);
  return buffer + num_digits;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}